

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_thread.hpp
# Opt level: O0

void __thiscall
so_5::disp::reuse::work_thread::details::
common_data_t<so_5::disp::reuse::work_thread::demand_queue_details::queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>_>
::common_data_t(common_data_t<so_5::disp::reuse::work_thread::demand_queue_details::queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>_>
                *this,lock_factory_t *queue_lock_factory)

{
  undefined8 local_18;
  lock_factory_t *queue_lock_factory_local;
  common_data_t<so_5::disp::reuse::work_thread::demand_queue_details::queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>_>
  *this_local;
  
  local_18 = queue_lock_factory;
  queue_lock_factory_local = (lock_factory_t *)this;
  std::thread::thread(&this->m_thread);
  std::atomic<so_5::disp::reuse::work_thread::details::status_t>::atomic(&this->m_status,stopped);
  std::
  function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
  ::operator()((function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>_()>
                *)&stack0xffffffffffffffe0);
  demand_queue_details::
  queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>
  ::queue_template_t(&this->m_queue,(lock_unique_ptr_t *)&stack0xffffffffffffffe0);
  std::
  unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
  ::~unique_ptr((unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
                 *)&stack0xffffffffffffffe0);
  std::thread::id::id(&this->m_thread_id);
  std::atomic<unsigned_long>::atomic(&this->m_demands_count,0);
  return;
}

Assistant:

common_data_t(
		queue_traits::lock_factory_t queue_lock_factory )
		:	m_queue( queue_lock_factory() )
	{}